

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O2

errr Term_key_push(wchar_t k)

{
  errr eVar1;
  ui_event ke;
  
  if (k != L'\0') {
    ke.type = EVT_KBRD;
    ke.key.mods = 0;
    ke.key.code = k;
    eVar1 = Term_event_push(&ke);
    return eVar1;
  }
  return -1;
}

Assistant:

errr Term_key_push(int k)
{
	ui_event ke;

	if (!k) return (-1);

	ke.type = EVT_KBRD;
	ke.key.code = k;
	ke.key.mods = 0;

	return Term_event_push(&ke);
}